

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K_Sequence_Parser.cpp
# Opt level: O0

h__SequenceParser * __thiscall
ASDCP::JP2K::SequenceParser::h__SequenceParser::ReadFrame(h__SequenceParser *this,FrameBuffer *FB)

{
  ui32_t num;
  bool bVar1;
  int iVar2;
  char *__s;
  ILogSink *this_00;
  FrameBuffer *in_RDX;
  CodestreamParser local_2a8 [6];
  undefined1 local_23c [8];
  PictureDescriptor PDesc;
  allocator<char> local_51;
  FrameBuffer local_50;
  _Self local_28;
  FrameBuffer *local_20;
  FrameBuffer *FB_local;
  h__SequenceParser *this_local;
  Result_t *result;
  
  local_20 = in_RDX;
  FB_local = FB;
  this_local = this;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&(FB->super_FrameBuffer).m_Capacity);
  bVar1 = std::operator==((_Self *)&FB[1].super_FrameBuffer.m_SourceLength,&local_28);
  if (bVar1) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_ENDOFFILE);
  }
  else {
    local_50.super_FrameBuffer.m_PlaintextOffset._3_1_ = 0;
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&FB[1].super_FrameBuffer.m_SourceLength);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    CodestreamParser::OpenReadFrame((CodestreamParser *)this,(string *)(FB + 2),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if ((-1 < iVar2) && ((FB[2].super_FrameBuffer.m_Capacity & 1) != 0)) {
      PictureDescriptor::PictureDescriptor((PictureDescriptor *)local_23c);
      CodestreamParser::FillPictureDescriptor(local_2a8,(PictureDescriptor *)(FB + 2));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_2a8);
      Kumu::Result_t::~Result_t((Result_t *)local_2a8);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if ((-1 < iVar2) &&
         (bVar1 = ASDCP::operator==((PictureDescriptor *)&FB[2].super_FrameBuffer.m_OwnMem,
                                    (PictureDescriptor *)local_23c), !bVar1)) {
        this_00 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (this_00,"JPEG-2000 codestream parameters do not match at frame %d\n",
                   (ulong)(*(int *)&(FB->super_FrameBuffer)._vptr_FrameBuffer + 1));
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)ASDCP::RESULT_RAW_FORMAT);
      }
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      num = *(ui32_t *)&(FB->super_FrameBuffer)._vptr_FrameBuffer;
      *(ui32_t *)&(FB->super_FrameBuffer)._vptr_FrameBuffer = num + 1;
      ASDCP::FrameBuffer::FrameNumber(local_20,num);
      std::
      _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&FB[1].super_FrameBuffer.m_SourceLength,0);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::JP2K::SequenceParser::h__SequenceParser::ReadFrame(FrameBuffer& FB)
{
  if ( m_CurrentFile == m_FileList.end() )
    return RESULT_ENDOFFILE;

  // open the file
  Result_t result = m_Parser.OpenReadFrame((*m_CurrentFile).c_str(), FB);

  if ( ASDCP_SUCCESS(result) && m_Pedantic )
    {
      PictureDescriptor PDesc;
      result = m_Parser.FillPictureDescriptor(PDesc);

      if ( ASDCP_SUCCESS(result) && ! ( m_PDesc == PDesc ) )
	{
	  Kumu::DefaultLogSink().Error("JPEG-2000 codestream parameters do not match at frame %d\n", m_FramesRead + 1);
	  result = RESULT_RAW_FORMAT;
	}
    }

  if ( ASDCP_SUCCESS(result) )
    {
      FB.FrameNumber(m_FramesRead++);
      m_CurrentFile++;
    }

  return result;
}